

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O0

bool __thiscall
QPageLayout::setMargins(QPageLayout *this,QMarginsF *margins,OutOfBoundsPolicy outOfBoundsPolicy)

{
  long lVar1;
  bool bVar2;
  QPageLayoutPrivate *pQVar3;
  int in_EDX;
  QMarginsF *in_RSI;
  long in_FS_OFFSET;
  qreal qVar4;
  qreal qVar5;
  QMarginsF clampedMargins;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QMarginsF *in_stack_ffffffffffffff50;
  QMarginsF *in_stack_ffffffffffffff80;
  QPageLayoutPrivate *in_stack_ffffffffffffff88;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544d6f);
  if (pQVar3->m_mode == FullPageMode) {
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544d89);
    bVar2 = ::operator!=(in_stack_ffffffffffffff50,
                         (QMarginsF *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
    ;
    if (bVar2) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach
                ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)in_stack_ffffffffffffff50);
      pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544dbe);
      (pQVar3->m_margins).m_left = in_RSI->m_left;
      (pQVar3->m_margins).m_top = in_RSI->m_top;
      (pQVar3->m_margins).m_right = in_RSI->m_right;
      (pQVar3->m_margins).m_bottom = in_RSI->m_bottom;
    }
    local_29 = true;
  }
  else if (in_EDX == 1) {
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544e40);
    QPageLayoutPrivate::clampMargins(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544e5f);
    bVar2 = ::operator!=(in_stack_ffffffffffffff50,
                         (QMarginsF *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
    ;
    if (bVar2) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach
                ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)in_stack_ffffffffffffff50);
      pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544e8d);
      (pQVar3->m_margins).m_left = -NAN;
      (pQVar3->m_margins).m_top = -NAN;
      (pQVar3->m_margins).m_right = -NAN;
      (pQVar3->m_margins).m_bottom = -NAN;
    }
    local_29 = true;
  }
  else {
    qVar4 = QMarginsF::left(in_RSI);
    pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544ee4);
    qVar5 = QMarginsF::left(&pQVar3->m_minMargins);
    if (qVar5 <= qVar4) {
      qVar4 = QMarginsF::right(in_RSI);
      pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544f1d);
      qVar5 = QMarginsF::right(&pQVar3->m_minMargins);
      if (qVar5 <= qVar4) {
        qVar4 = QMarginsF::top(in_RSI);
        pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544f56);
        qVar5 = QMarginsF::top(&pQVar3->m_minMargins);
        if (qVar5 <= qVar4) {
          qVar4 = QMarginsF::bottom(in_RSI);
          pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544f8f);
          qVar5 = QMarginsF::bottom(&pQVar3->m_minMargins);
          if (qVar5 <= qVar4) {
            qVar4 = QMarginsF::left(in_RSI);
            pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                               ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544fc8);
            qVar5 = QMarginsF::left(&pQVar3->m_maxMargins);
            if (qVar4 <= qVar5) {
              qVar4 = QMarginsF::right(in_RSI);
              pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                                 ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544ffe);
              qVar5 = QMarginsF::right(&pQVar3->m_maxMargins);
              if (qVar4 <= qVar5) {
                qVar4 = QMarginsF::top(in_RSI);
                pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                                   ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x545034);
                qVar5 = QMarginsF::top(&pQVar3->m_maxMargins);
                if (qVar4 <= qVar5) {
                  qVar4 = QMarginsF::bottom(in_RSI);
                  pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x54506a);
                  qVar5 = QMarginsF::bottom(&pQVar3->m_maxMargins);
                  if (qVar4 <= qVar5) {
                    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x545096);
                    bVar2 = ::operator!=(in_stack_ffffffffffffff50,
                                         (QMarginsF *)
                                         CONCAT17(in_stack_ffffffffffffff4f,
                                                  in_stack_ffffffffffffff48));
                    if (bVar2) {
                      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach
                                ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)
                                 in_stack_ffffffffffffff50);
                      pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                                         ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)
                                          0x5450cb);
                      (pQVar3->m_margins).m_left = in_RSI->m_left;
                      (pQVar3->m_margins).m_top = in_RSI->m_top;
                      (pQVar3->m_margins).m_right = in_RSI->m_right;
                      (pQVar3->m_margins).m_bottom = in_RSI->m_bottom;
                    }
                    local_29 = true;
                    goto LAB_00545101;
                  }
                }
              }
            }
          }
        }
      }
    }
    local_29 = false;
  }
LAB_00545101:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QPageLayout::setMargins(const QMarginsF &margins, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == FullPageMode) {
        if (margins != d->m_margins) {
            d.detach();
            d->m_margins = margins;
        }
        return true;
    }

    if (outOfBoundsPolicy == OutOfBoundsPolicy::Clamp) {
        const QMarginsF clampedMargins = d->clampMargins(margins);
        if (clampedMargins != d->m_margins) {
            d.detach();
            d->m_margins = clampedMargins;
        }
        return true;
    }

    if (margins.left() >= d->m_minMargins.left()
        && margins.right() >= d->m_minMargins.right()
        && margins.top() >= d->m_minMargins.top()
        && margins.bottom() >= d->m_minMargins.bottom()
        && margins.left() <= d->m_maxMargins.left()
        && margins.right() <= d->m_maxMargins.right()
        && margins.top() <= d->m_maxMargins.top()
        && margins.bottom() <= d->m_maxMargins.bottom()) {
        if (margins != d->m_margins) {
            d.detach();
            d->m_margins = margins;
        }
        return true;
    }

    return false;
}